

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

float cmach(int job)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = 1.0;
  do {
    fVar3 = fVar3 * 0.5;
  } while (1.0 < fVar3 + 1.0);
  fVar2 = 1.0;
  do {
    do {
      fVar1 = fVar2;
      fVar2 = fVar1 * 0.0625;
    } while (fVar2 != 0.0);
  } while (NAN(fVar2));
  fVar2 = (fVar1 / (fVar3 + fVar3)) * 100.0;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar3 = fVar3 + fVar3;
  if (job != 1) {
    if (job == 3) {
      fVar3 = 1.0 / fVar2;
    }
    else {
      fVar3 = fVar2;
      if (job != 2) {
        fVar3 = 0.0;
      }
    }
  }
  return fVar3;
}

Assistant:

float cmach ( int job )

//****************************************************************************80
//
//  Purpose:
//
//    CMACH computes machine parameters for complex arithmetic.
//
//  Discussion:
//
//    Assume the computer has
//
//      B = base of arithmetic;
//      T = number of base B digits;
//      L = smallest possible exponent;
//      U = largest possible exponent;
//
//    then
//
//      EPS = B^(1-T)
//      TINY = 100.0 * B^(-L+T)
//      HUGE = 0.01 * B^(U-T)
//
//    If complex division is done by
//
//      1 / (X+i*Y) = (X-i*Y) / (X^2+Y^2)
//
//    then
//
//      TINY = sqrt ( TINY )
//      HUGE = sqrt ( HUGE )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int JOB:
//    1, EPS is desired;
//    2, TINY is desired;
//    3, HUGE is desired.
//
//    Output, float CMACH, the requested value.
//
{
  float eps;
  float huge;
  float s;
  complex <float> temp1;
  complex <float> temp2;
  complex <float> temp3;
  float tiny;
  float value;

  eps = 1.0;

  for ( ; ; )
  {
    eps = eps / 2.0;
    s = 1.0 + eps;
    if ( s <= 1.0 )
    {
      break;
    }
  }

  eps = 2.0 * eps;

  s = 1.0;

  for ( ; ; )
  {
    tiny = s;
    s = s / 16.0;

    if ( s * 1.0 == 0.0 )
    {
      break;
    }
  }

  tiny = ( tiny / eps ) * 100.0;
//
//  Had to insert this manually!
//
  tiny = sqrt ( tiny );

  if ( false )
  {
    temp1 = complex <float> ( 1.0,  0.0 );
    temp2 = complex <float> ( tiny, 0.0 );
    temp3 = temp1 / temp2;

    s = real ( temp3 );

    if ( s != 1.0 / tiny )
    {
      tiny = sqrt ( tiny );
    }
  }

  huge = 1.0 / tiny;

  if ( job == 1 )
  {
    value = eps;
  }
  else if ( job == 2 )
  {
    value = tiny;
  }
  else if ( job == 3 )
  {
    value = huge;
  }
  else
  {
    value = 0.0;
  }

  return value;
}